

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

void xmlSchematronReportPattern
               (xmlSchematronValidCtxtPtr ctxt,xmlSchematronPatternPtr_conflict pattern)

{
  char local_408 [8];
  char msg [1000];
  xmlSchematronPatternPtr_conflict pattern_local;
  xmlSchematronValidCtxtPtr ctxt_local;
  
  if ((((ctxt != (xmlSchematronValidCtxtPtr)0x0) &&
       (pattern != (xmlSchematronPatternPtr_conflict)0x0)) && ((ctxt->flags & 1U) == 0)) &&
     ((((ctxt->flags & 8U) == 0 && ((ctxt->flags & 4U) == 0)) && (pattern->name != (xmlChar *)0x0)))
     ) {
    snprintf(local_408,999,"Pattern: %s\n",pattern->name);
    xmlSchematronReportOutput(ctxt,(xmlNodePtr)0x0,local_408);
  }
  return;
}

Assistant:

static void
xmlSchematronReportPattern(xmlSchematronValidCtxtPtr ctxt,
                           xmlSchematronPatternPtr pattern) {
    if ((ctxt == NULL) || (pattern == NULL))
        return;
    if ((ctxt->flags & XML_SCHEMATRON_OUT_QUIET) || (ctxt->flags & XML_SCHEMATRON_OUT_ERROR)) /* Error gives pattern name as part of error */
        return;
    if (ctxt->flags & XML_SCHEMATRON_OUT_XML) {
        /* TODO */
    } else {
        char msg[1000];

        if (pattern->name == NULL)
            return;
        snprintf(msg, 999, "Pattern: %s\n", (const char *) pattern->name);
        xmlSchematronReportOutput(ctxt, NULL, &msg[0]);
    }
}